

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdUVTexture>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdUVTexture *texture,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Property *pPVar3;
  AttrMeta *pAVar4;
  AttrMeta *pAVar5;
  string *psVar6;
  size_type sVar7;
  mapped_type *this;
  ostream *poVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  TypedTerminalAttribute<std::array<float,_3UL>_> *in_stack_ffffffffffffe228;
  bool local_1d59;
  bool local_1d31;
  bool local_1d09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cc0 [32];
  string local_1ca0 [32];
  ostringstream local_1c80 [8];
  ostringstream ss_w_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1af8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ad8 [39];
  allocator local_1ab1;
  string local_1ab0 [32];
  string local_1a90;
  ostringstream local_1a70 [8];
  ostringstream ss_e_6;
  allocator local_18f1;
  undefined1 local_18f0 [32];
  undefined1 local_18d0 [40];
  ParseResult ret_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1868 [39];
  allocator local_1841;
  string local_1840 [32];
  string local_1820;
  ostringstream local_1800 [8];
  ostringstream ss_e_5;
  allocator local_1681;
  string local_1680;
  string local_1660;
  undefined1 local_1640 [8];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f8 [39];
  allocator local_15d1;
  string local_15d0 [32];
  string local_15b0;
  ostringstream local_1590 [8];
  ostringstream ss_e_4;
  allocator local_1411;
  string local_1410;
  string local_13f0;
  undefined1 local_13d0 [8];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1388 [39];
  allocator local_1361;
  string local_1360 [32];
  string local_1340;
  ostringstream local_1320 [8];
  ostringstream ss_e_3;
  allocator local_11a1;
  string local_11a0;
  string local_1180;
  undefined1 local_1160 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118 [39];
  allocator local_10f1;
  string local_10f0 [32];
  string local_10d0;
  ostringstream local_10b0 [8];
  ostringstream ss_e_2;
  allocator local_f31;
  string local_f30;
  string local_f10;
  undefined1 local_ef0 [8];
  ParseResult ret_2;
  allocator local_eb1;
  undefined1 local_eb0 [71];
  allocator local_e69;
  string local_e68;
  undefined1 local_e48 [8];
  function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_2;
  Attribute *attr_5;
  allocator local_e09;
  undefined1 local_e08 [40];
  Attribute *attr_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0 [32];
  ostringstream local_da0 [8];
  ostringstream ss_w_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  string local_c08;
  allocator local_be1;
  undefined1 local_be0 [56];
  undefined1 local_ba8 [71];
  allocator local_b61;
  string local_b60;
  undefined1 local_b40 [8];
  function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_3;
  allocator local_b01;
  undefined1 local_b00 [40];
  Attribute *attr_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8 [32];
  ostringstream local_a98 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  string local_900;
  allocator local_8d9;
  undefined1 local_8d8 [56];
  undefined1 local_8a0 [71];
  allocator local_859;
  string local_858;
  undefined1 local_838 [8];
  function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_7f9;
  undefined1 local_7f8 [40];
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0 [32];
  ostringstream local_790 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  string local_5f8;
  allocator local_5d1;
  undefined1 local_5d0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590 [39];
  allocator local_569;
  string local_568 [32];
  string local_548;
  ostringstream local_528 [8];
  ostringstream ss_e_1;
  allocator local_3a9;
  string local_3a8;
  string local_388;
  undefined1 local_368 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8;
  ostringstream local_2b8 [8];
  ostringstream ss_e;
  undefined4 local_140;
  allocator local_139;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  allocator local_99;
  undefined1 local_98 [32];
  undefined1 local_78 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  anon_class_1_0_00000001 WrapHandler;
  anon_class_1_0_00000001 SourceColorSpaceHandler;
  string *err_local;
  string *warn_local;
  UsdUVTexture *texture_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_78);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_98,"info:id",&local_99);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78,(value_type *)local_98);
  ::std::__cxx11::string::~string((string *)local_98);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   *)properties);
LAB_002d559c:
  bVar1 = ::std::operator!=(&__end2,(_Self *)&prop);
  if (!bVar1) {
    spec_local._7_1_ = 1;
LAB_002d7769:
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
    return (bool)(spec_local._7_1_ & 1);
  }
  ret.err.field_2._8_8_ =
       ::std::
       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
       ::operator*(&__end2);
  ::std::__cxx11::string::string((string *)&local_118,(string *)ret.err.field_2._8_8_);
  pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_138,"inputs:file",&local_139);
  psVar6 = &local_138;
  anon_unknown_0::ParseTypedAttribute<tinyusdz::value::AssetPath>
            ((ParseResult *)local_f8,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,&local_118,pPVar3,psVar6,&texture->file);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_139);
  ::std::__cxx11::string::~string((string *)&local_118);
  if ((local_f8._0_4_ == Success) || (local_f8._0_4_ == AlreadyProcessed)) {
    local_140 = 3;
  }
  else if (local_f8._0_4_ == Unmatched) {
    local_140 = 0;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_2b8);
    poVar8 = ::std::operator<<((ostream *)local_2b8,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xfed);
    ::std::operator<<(poVar8," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_2f8,"Parsing attribute `{}` failed. Error: {}",&local_2f9);
    fmt::format<char[12],std::__cxx11::string>
              (&local_2d8,(fmt *)local_2f8,(string *)"inputs:file",(char (*) [12])&ret,psVar6);
    poVar8 = ::std::operator<<((ostream *)local_2b8,(string *)&local_2d8);
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::string::~string((string *)&local_2d8);
    ::std::__cxx11::string::~string(local_2f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::operator+(local_320,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ret_1.err.field_2._M_local_buf + 8));
      ::std::__cxx11::string::operator=((string *)err,(string *)local_320);
      ::std::__cxx11::string::~string((string *)local_320);
      ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
    }
    spec_local._7_1_ = 0;
    local_140 = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_2b8);
  }
  anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_f8);
  if (local_140 == 0) {
    ::std::__cxx11::string::string((string *)&local_388,(string *)ret.err.field_2._8_8_);
    pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3a8,"inputs:st",&local_3a9);
    psVar6 = &local_3a8;
    anon_unknown_0::ParseTypedAttribute<tinyusdz::value::texcoord2f>
              ((ParseResult *)local_368,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,&local_388,pPVar3,psVar6,&texture->st);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    ::std::__cxx11::string::~string((string *)&local_388);
    if ((local_368._0_4_ == Success) || (local_368._0_4_ == AlreadyProcessed)) {
      local_140 = 3;
    }
    else if (local_368._0_4_ == Unmatched) {
      local_140 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_528);
      poVar8 = ::std::operator<<((ostream *)local_528,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xfef);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_568,"Parsing attribute `{}` failed. Error: {}",&local_569);
      fmt::format<char[10],std::__cxx11::string>
                (&local_548,(fmt *)local_568,(string *)"inputs:st",(char (*) [10])&ret_1,psVar6);
      poVar8 = ::std::operator<<((ostream *)local_528,(string *)&local_548);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)&local_548);
      ::std::__cxx11::string::~string(local_568);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_569);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_590,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_5d0 + 0x20));
        ::std::__cxx11::string::operator=((string *)err,(string *)local_590);
        ::std::__cxx11::string::~string((string *)local_590);
        ::std::__cxx11::string::~string((string *)(local_5d0 + 0x20));
      }
      spec_local._7_1_ = 0;
      local_140 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_528);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_368);
    if (local_140 != 0) goto joined_r0x002d5f81;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ret.err.field_2._8_8_,"inputs:sourceColorSpace");
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_5d0,"inputs:sourceColorSpace",&local_5d1);
      sVar7 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_78,(key_type *)local_5d0);
      ::std::__cxx11::string::~string((string *)local_5d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      if (sVar7 == 0) {
        Property::value_type_name_abi_cxx11_(&local_5f8,(Property *)(ret.err.field_2._8_8_ + 0x20));
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        _Var2 = ::std::operator==(&local_5f8,&local_618);
        local_1d09 = false;
        if (_Var2) {
          bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
          local_1d09 = false;
          if (bVar1) {
            local_1d09 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
          }
        }
        ::std::__cxx11::string::~string((string *)&local_618);
        ::std::__cxx11::string::~string((string *)&local_5f8);
        if (local_1d09 == false) {
          fun._M_invoker =
               (_Invoker_type)Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,std::__cxx11::string>(std::__cxx11::string_const&)>
          ::
          function<tinyusdz::prim::ReconstructShader<tinyusdz::UsdUVTexture>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::UsdUVTexture*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__0&,void>
                    ((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,std::__cxx11::string>(std::__cxx11::string_const&)>
                      *)local_838,
                     (anon_class_1_0_00000001 *)
                     ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_858,"inputs:sourceColorSpace",&local_859);
          bVar1 = options->strict_allowedToken_check;
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(local_8a0 + 0x20),
                     (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_838);
          in_stack_ffffffffffffe228 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
          bVar1 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::SourceColorSpace,tinyusdz::UsdUVTexture::SourceColorSpace>
                            (&local_858,(bool)(bVar1 & 1),
                             (EnumHandlerFun<tinyusdz::UsdUVTexture::SourceColorSpace> *)
                             (local_8a0 + 0x20),(Attribute *)fun._M_invoker,
                             &texture->sourceColorSpace,warn,err);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)(local_8a0 + 0x20));
          ::std::__cxx11::string::~string((string *)&local_858);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_859);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            pAVar4 = Attribute::metas((Attribute *)fun._M_invoker);
            pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                     ::metas(&texture->sourceColorSpace);
            AttrMetas::operator=(pAVar5,pAVar4);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)local_8a0,"inputs:sourceColorSpace",(allocator *)(local_8d8 + 0x37)
                      );
            pVar9 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_78,(value_type *)local_8a0);
            local_8d8._32_8_ = pVar9.first._M_node;
            local_8d8[0x28] = pVar9.second;
            ::std::__cxx11::string::~string((string *)local_8a0);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_8d8 + 0x37));
            local_140 = 3;
          }
          else {
            spec_local._7_1_ = 0;
            local_140 = 1;
          }
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_838);
          goto joined_r0x002d5f81;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_790);
        poVar8 = ::std::operator<<((ostream *)local_790,"[warn]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xff2);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_790,"No value assigned to `");
        poVar8 = ::std::operator<<(poVar8,"inputs:sourceColorSpace");
        poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
        ::std::operator<<(poVar8,"\n");
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_7b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &attr);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_7b0);
          ::std::__cxx11::string::~string((string *)local_7b0);
          ::std::__cxx11::string::~string((string *)&attr);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_790);
        local_7f8._32_8_ = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
        pAVar4 = Attribute::metas((Attribute *)local_7f8._32_8_);
        pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                 ::metas(&texture->sourceColorSpace);
        AttrMetas::operator=(pAVar5,pAVar4);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_7f8,"inputs:sourceColorSpace",&local_7f9);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,(value_type *)local_7f8);
        ::std::__cxx11::string::~string((string *)local_7f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
      }
      goto LAB_002d774a;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ret.err.field_2._8_8_,"inputs:wrapS");
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_8d8,"inputs:wrapS",&local_8d9);
      sVar7 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_78,(key_type *)local_8d8);
      ::std::__cxx11::string::~string((string *)local_8d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      if (sVar7 == 0) {
        Property::value_type_name_abi_cxx11_(&local_900,(Property *)(ret.err.field_2._8_8_ + 0x20));
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        _Var2 = ::std::operator==(&local_900,&local_920);
        local_1d31 = false;
        if (_Var2) {
          bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
          local_1d31 = false;
          if (bVar1) {
            local_1d31 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
          }
        }
        ::std::__cxx11::string::~string((string *)&local_920);
        ::std::__cxx11::string::~string((string *)&local_900);
        if (local_1d31 == false) {
          fun_1._M_invoker =
               (_Invoker_type)Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,std::__cxx11::string>(std::__cxx11::string_const&)>
          ::
          function<tinyusdz::prim::ReconstructShader<tinyusdz::UsdUVTexture>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::UsdUVTexture*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__1&,void>
                    ((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,std::__cxx11::string>(std::__cxx11::string_const&)>
                      *)local_b40,
                     (anon_class_1_0_00000001 *)
                     ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_b60,"inputs:wrapS",&local_b61);
          bVar1 = options->strict_allowedToken_check;
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(local_ba8 + 0x20),
                     (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_b40);
          in_stack_ffffffffffffe228 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
          bVar1 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                            (&local_b60,(bool)(bVar1 & 1),
                             (EnumHandlerFun<tinyusdz::UsdUVTexture::Wrap> *)(local_ba8 + 0x20),
                             (Attribute *)fun_1._M_invoker,&texture->wrapS,warn,err);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)(local_ba8 + 0x20));
          ::std::__cxx11::string::~string((string *)&local_b60);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_b61);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            pAVar4 = Attribute::metas((Attribute *)fun_1._M_invoker);
            pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                     ::metas(&texture->wrapS);
            AttrMetas::operator=(pAVar5,pAVar4);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)local_ba8,"inputs:wrapS",(allocator *)(local_be0 + 0x37));
            pVar9 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_78,(value_type *)local_ba8);
            local_be0._32_8_ = pVar9.first._M_node;
            local_be0[0x28] = pVar9.second;
            ::std::__cxx11::string::~string((string *)local_ba8);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_be0 + 0x37));
            local_140 = 3;
          }
          else {
            spec_local._7_1_ = 0;
            local_140 = 1;
          }
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_b40);
          goto joined_r0x002d5f81;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_a98);
        poVar8 = ::std::operator<<((ostream *)local_a98,"[warn]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xff5);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_a98,"No value assigned to `");
        poVar8 = ::std::operator<<(poVar8,"inputs:wrapS");
        poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
        ::std::operator<<(poVar8,"\n");
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_ab8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &attr_2);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_ab8);
          ::std::__cxx11::string::~string((string *)local_ab8);
          ::std::__cxx11::string::~string((string *)&attr_2);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_a98);
        local_b00._32_8_ = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
        pAVar4 = Attribute::metas((Attribute *)local_b00._32_8_);
        pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
                 metas(&texture->wrapS);
        AttrMetas::operator=(pAVar5,pAVar4);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_b00,"inputs:wrapS",&local_b01);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,(value_type *)local_b00);
        ::std::__cxx11::string::~string((string *)local_b00);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b01);
      }
      goto LAB_002d774a;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ret.err.field_2._8_8_,"inputs:wrapT");
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_be0,"inputs:wrapT",&local_be1);
      sVar7 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_78,(key_type *)local_be0);
      ::std::__cxx11::string::~string((string *)local_be0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_be1);
      if (sVar7 == 0) {
        Property::value_type_name_abi_cxx11_(&local_c08,(Property *)(ret.err.field_2._8_8_ + 0x20));
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        _Var2 = ::std::operator==(&local_c08,&local_c28);
        local_1d59 = false;
        if (_Var2) {
          bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
          local_1d59 = false;
          if (bVar1) {
            local_1d59 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
          }
        }
        ::std::__cxx11::string::~string((string *)&local_c28);
        ::std::__cxx11::string::~string((string *)&local_c08);
        if (local_1d59 == false) {
          fun_2._M_invoker =
               (_Invoker_type)Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,std::__cxx11::string>(std::__cxx11::string_const&)>
          ::
          function<tinyusdz::prim::ReconstructShader<tinyusdz::UsdUVTexture>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::UsdUVTexture*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__1&,void>
                    ((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,std::__cxx11::string>(std::__cxx11::string_const&)>
                      *)local_e48,
                     (anon_class_1_0_00000001 *)
                     ((long)&table._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_e68,"inputs:wrapT",&local_e69);
          bVar1 = options->strict_allowedToken_check;
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(local_eb0 + 0x20),
                     (function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_e48);
          in_stack_ffffffffffffe228 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
          bVar1 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                            (&local_e68,(bool)(bVar1 & 1),
                             (EnumHandlerFun<tinyusdz::UsdUVTexture::Wrap> *)(local_eb0 + 0x20),
                             (Attribute *)fun_2._M_invoker,&texture->wrapT,warn,err);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)(local_eb0 + 0x20));
          ::std::__cxx11::string::~string((string *)&local_e68);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_e69);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            pAVar4 = Attribute::metas((Attribute *)fun_2._M_invoker);
            pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                     ::metas(&texture->wrapT);
            AttrMetas::operator=(pAVar5,pAVar4);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_eb0,"inputs:wrapT",&local_eb1);
            pVar9 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_78,(value_type *)local_eb0);
            ret_2.err.field_2._8_8_ = pVar9.first._M_node;
            ::std::__cxx11::string::~string((string *)local_eb0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
            local_140 = 3;
          }
          else {
            spec_local._7_1_ = 0;
            local_140 = 1;
          }
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_e48);
          goto joined_r0x002d5f81;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_da0);
        poVar8 = ::std::operator<<((ostream *)local_da0,"[warn]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xff8);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_da0,"No value assigned to `");
        poVar8 = ::std::operator<<(poVar8,"inputs:wrapT");
        poVar8 = ::std::operator<<(poVar8,"` token attribute. Set default token value.");
        ::std::operator<<(poVar8,"\n");
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_dc0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &attr_4);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_dc0);
          ::std::__cxx11::string::~string((string *)local_dc0);
          ::std::__cxx11::string::~string((string *)&attr_4);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_da0);
        local_e08._32_8_ = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
        pAVar4 = Attribute::metas((Attribute *)local_e08._32_8_);
        pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
                 metas(&texture->wrapT);
        AttrMetas::operator=(pAVar5,pAVar4);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_e08,"inputs:wrapT",&local_e09);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,(value_type *)local_e08);
        ::std::__cxx11::string::~string((string *)local_e08);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e09);
      }
      goto LAB_002d774a;
    }
    ::std::__cxx11::string::string((string *)&local_f10,(string *)ret.err.field_2._8_8_);
    pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f30,"outputs:r",&local_f31);
    psVar6 = &local_f30;
    anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
              ((ParseResult *)local_ef0,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,&local_f10,pPVar3,psVar6,&texture->outputsR);
    ::std::__cxx11::string::~string((string *)&local_f30);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f31);
    ::std::__cxx11::string::~string((string *)&local_f10);
    if ((local_ef0._0_4_ == Success) || (local_ef0._0_4_ == AlreadyProcessed)) {
      local_140 = 3;
    }
    else if (local_ef0._0_4_ == Unmatched) {
      local_140 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_10b0);
      poVar8 = ::std::operator<<((ostream *)local_10b0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xffa);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_10f0,"Parsing shader output property `{}` failed. Error: {}",&local_10f1);
      fmt::format<char[10],std::__cxx11::string>
                (&local_10d0,(fmt *)local_10f0,(string *)"outputs:r",(char (*) [10])&ret_2,psVar6);
      poVar8 = ::std::operator<<((ostream *)local_10b0,(string *)&local_10d0);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)&local_10d0);
      ::std::__cxx11::string::~string(local_10f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_1118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_3.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=((string *)err,(string *)local_1118);
        ::std::__cxx11::string::~string((string *)local_1118);
        ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      local_140 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_10b0);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_ef0);
    if (local_140 != 0) goto joined_r0x002d5f81;
    ::std::__cxx11::string::string((string *)&local_1180,(string *)ret.err.field_2._8_8_);
    pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_11a0,"outputs:g",&local_11a1);
    psVar6 = &local_11a0;
    anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
              ((ParseResult *)local_1160,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,&local_1180,pPVar3,psVar6,&texture->outputsG);
    ::std::__cxx11::string::~string((string *)&local_11a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
    ::std::__cxx11::string::~string((string *)&local_1180);
    if ((local_1160._0_4_ == Success) || (local_1160._0_4_ == AlreadyProcessed)) {
      local_140 = 3;
    }
    else if (local_1160._0_4_ == Unmatched) {
      local_140 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1320);
      poVar8 = ::std::operator<<((ostream *)local_1320,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xffc);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1360,"Parsing shader output property `{}` failed. Error: {}",&local_1361);
      fmt::format<char[10],std::__cxx11::string>
                (&local_1340,(fmt *)local_1360,(string *)"outputs:g",(char (*) [10])&ret_3,psVar6);
      poVar8 = ::std::operator<<((ostream *)local_1320,(string *)&local_1340);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)&local_1340);
      ::std::__cxx11::string::~string(local_1360);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1361);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_1388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_4.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=((string *)err,(string *)local_1388);
        ::std::__cxx11::string::~string((string *)local_1388);
        ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      local_140 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_1320);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1160);
    if (local_140 == 0) {
      ::std::__cxx11::string::string((string *)&local_13f0,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1410,"outputs:b",&local_1411);
      psVar6 = &local_1410;
      anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                ((ParseResult *)local_13d0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,&local_13f0,pPVar3,psVar6,&texture->outputsB);
      ::std::__cxx11::string::~string((string *)&local_1410);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1411);
      ::std::__cxx11::string::~string((string *)&local_13f0);
      if ((local_13d0._0_4_ == Success) || (local_13d0._0_4_ == AlreadyProcessed)) {
        local_140 = 3;
      }
      else if (local_13d0._0_4_ == Unmatched) {
        local_140 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1590);
        poVar8 = ::std::operator<<((ostream *)local_1590,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xffe);
        ::std::operator<<(poVar8," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_15d0,"Parsing shader output property `{}` failed. Error: {}",&local_15d1);
        fmt::format<char[10],std::__cxx11::string>
                  (&local_15b0,(fmt *)local_15d0,(string *)"outputs:b",(char (*) [10])&ret_4,psVar6)
        ;
        poVar8 = ::std::operator<<((ostream *)local_1590,(string *)&local_15b0);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::~string((string *)&local_15b0);
        ::std::__cxx11::string::~string(local_15d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_15d1);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_15f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_5.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=((string *)err,(string *)local_15f8);
          ::std::__cxx11::string::~string((string *)local_15f8);
          ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_140 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1590);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_13d0);
      if (local_140 == 0) {
        ::std::__cxx11::string::string((string *)&local_1660,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1680,"outputs:a",&local_1681);
        psVar6 = &local_1680;
        anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                  ((ParseResult *)local_1640,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_1660,pPVar3,psVar6,&texture->outputsA);
        ::std::__cxx11::string::~string((string *)&local_1680);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1681);
        ::std::__cxx11::string::~string((string *)&local_1660);
        if ((local_1640._0_4_ == DefineOnly) || (local_1640._0_4_ == PathVector)) {
          local_140 = 3;
        }
        else if (local_1640._0_4_ == Path) {
          local_140 = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1800);
          poVar8 = ::std::operator<<((ostream *)local_1800,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1000);
          ::std::operator<<(poVar8," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1840,"Parsing shader output property `{}` failed. Error: {}",&local_1841)
          ;
          fmt::format<char[10],std::__cxx11::string>
                    (&local_1820,(fmt *)local_1840,(string *)"outputs:a",(char (*) [10])&ret_5,
                     psVar6);
          poVar8 = ::std::operator<<((ostream *)local_1800,(string *)&local_1820);
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::~string((string *)&local_1820);
          ::std::__cxx11::string::~string(local_1840);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1841);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1868,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_6.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_1868);
            ::std::__cxx11::string::~string((string *)local_1868);
            ::std::__cxx11::string::~string((string *)(ret_6.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          local_140 = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1800);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1640);
        if (local_140 == 0) {
          ::std::__cxx11::string::string((string *)local_18d0,(string *)ret.err.field_2._8_8_);
          psVar6 = (string *)(ret.err.field_2._8_8_ + 0x20);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_18f0,"outputs:rgb",&local_18f1);
          pPVar3 = (Property *)local_18f0;
          (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,3ul>>
                    ((ParseResult *)(local_18d0 + 0x20),(_anonymous_namespace_ *)local_78,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_18d0,psVar6,pPVar3,(string *)&texture->outputsRGB,
                     in_stack_ffffffffffffe228);
          ::std::__cxx11::string::~string((string *)local_18f0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_18f1);
          ::std::__cxx11::string::~string((string *)local_18d0);
          if ((local_18d0._32_4_ == 0) || (local_18d0._32_4_ == 2)) {
            local_140 = 3;
          }
          else if (local_18d0._32_4_ == 1) {
            local_140 = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1a70);
            poVar8 = ::std::operator<<((ostream *)local_1a70,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1002);
            ::std::operator<<(poVar8," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1ab0,"Parsing shader output property `{}` failed. Error: {}",
                       &local_1ab1);
            fmt::format<char[12],std::__cxx11::string>
                      (&local_1a90,(fmt *)local_1ab0,(string *)"outputs:rgb",(char (*) [12])&ret_6,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
            poVar8 = ::std::operator<<((ostream *)local_1a70,(string *)&local_1a90);
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::string::~string((string *)&local_1a90);
            ::std::__cxx11::string::~string(local_1ab0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1ab1);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1ad8,local_1af8);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_1ad8);
              ::std::__cxx11::string::~string((string *)local_1ad8);
              ::std::__cxx11::string::~string((string *)local_1af8);
            }
            spec_local._7_1_ = 0;
            local_140 = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1a70);
          }
          anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_18d0 + 0x20));
          if (local_140 == 0) {
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,(key_type *)ret.err.field_2._8_8_);
            if (sVar7 == 0) {
              pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   *)&(texture->super_ShaderNode).super_UsdShadePrim.props,
                                  (key_type *)ret.err.field_2._8_8_);
              Property::operator=(this,pPVar3);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_78,(value_type *)ret.err.field_2._8_8_);
            }
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_78,(key_type *)ret.err.field_2._8_8_);
            if (sVar7 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_1c80);
              poVar8 = ::std::operator<<((ostream *)local_1c80,"[warn]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"ReconstructShader");
              poVar8 = ::std::operator<<(poVar8,"():");
              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1004);
              ::std::operator<<(poVar8," ");
              ::std::operator+((char *)local_1ca0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Unsupported/unimplemented property: ");
              poVar8 = ::std::operator<<((ostream *)local_1c80,local_1ca0);
              ::std::operator<<(poVar8,"\n");
              ::std::__cxx11::string::~string(local_1ca0);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1cc0,local_1ce0);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_1cc0);
                ::std::__cxx11::string::~string((string *)local_1cc0);
                ::std::__cxx11::string::~string((string *)local_1ce0);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1c80);
            }
            goto LAB_002d774a;
          }
          goto joined_r0x002d5f81;
        }
      }
      if (local_140 == 3) goto LAB_002d774a;
      goto LAB_002d7769;
    }
  }
joined_r0x002d5f81:
  if (local_140 != 3) goto LAB_002d7769;
LAB_002d774a:
  ::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
  ::operator++(&__end2);
  goto LAB_002d559c;
}

Assistant:

bool ReconstructShader<UsdUVTexture>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdUVTexture *texture,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;

  auto SourceColorSpaceHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::SourceColorSpace, std::string> {
    using EnumTy = std::pair<UsdUVTexture::SourceColorSpace, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::SourceColorSpace::Auto, "auto"),
        std::make_pair(UsdUVTexture::SourceColorSpace::Raw, "raw"),
        std::make_pair(UsdUVTexture::SourceColorSpace::SRGB, "sRGB"),
    };

    return EnumHandler<UsdUVTexture::SourceColorSpace>(
        "inputs:sourceColorSpace", tok, enums);
  };

  auto WrapHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::Wrap, std::string> {
    using EnumTy = std::pair<UsdUVTexture::Wrap, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::Wrap::UseMetadata, "useMetadata"),
        std::make_pair(UsdUVTexture::Wrap::Black, "black"),
        std::make_pair(UsdUVTexture::Wrap::Clamp, "clamp"),
        std::make_pair(UsdUVTexture::Wrap::Repeat, "repeat"),
        std::make_pair(UsdUVTexture::Wrap::Mirror, "mirror"),
    };

    return EnumHandler<UsdUVTexture::Wrap>(
        "inputs:wrap*", tok, enums);
  };

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    DCOUT("prop.name = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:file", UsdUVTexture, texture->file)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:st", UsdUVTexture,
                          texture->st)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:sourceColorSpace",
                       UsdUVTexture::SourceColorSpace, SourceColorSpaceHandler, UsdUVTexture,
                       texture->sourceColorSpace, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapS",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapS, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapT",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapT, options.strict_allowedToken_check)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:r", UsdUVTexture,
                                  texture->outputsR)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:g", UsdUVTexture,
                                  texture->outputsG)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:b", UsdUVTexture,
                                  texture->outputsB)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:a", UsdUVTexture,
                                  texture->outputsA)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:rgb", UsdUVTexture,
                                  texture->outputsRGB)
    ADD_PROPERTY(table, prop, UsdUVTexture, texture->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("UsdUVTexture reconstructed.");
  return true;
}